

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Instruction::dump(Instruction *this,Vector<unsigned_int> *out)

{
  pointer puVar1;
  int op;
  long lVar2;
  long lVar3;
  uint local_24;
  
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
  emplace_back<unsigned_int>(out,&local_24);
  if (this->typeId != 0) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
              (out,&this->typeId);
  }
  if (this->resultId != 0) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
              (out,&this->resultId);
  }
  lVar3 = 0;
  for (lVar2 = 0;
      puVar1 = (this->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->operands).
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2);
      lVar2 = lVar2 + 1) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
              (out,(value_type_conflict1 *)((long)puVar1 + lVar3));
    lVar3 = lVar3 + 4;
  }
  return;
}

Assistant:

void dump(dxil_spv::Vector<unsigned int>& out) const
    {
        // Compute the wordCount
        unsigned int wordCount = 1;
        if (typeId)
            ++wordCount;
        if (resultId)
            ++wordCount;
        wordCount += (unsigned int)operands.size();

        // Write out the beginning of the instruction
        out.push_back(((wordCount) << WordCountShift) | opCode);
        if (typeId)
            out.push_back(typeId);
        if (resultId)
            out.push_back(resultId);

        // Write out the operands
        for (int op = 0; op < (int)operands.size(); ++op)
            out.push_back(operands[op]);
    }